

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O0

int16_t ** __thiscall webrtc::AudioBuffer::split_channels(AudioBuffer *this,Band band)

{
  pointer pIVar1;
  ChannelBuffer<short> *pCVar2;
  AudioBuffer *local_30;
  Band band_local;
  AudioBuffer *this_local;
  
  this->mixed_low_pass_valid_ = false;
  pIVar1 = std::unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>::
           get(&this->split_data_);
  if (pIVar1 == (pointer)0x0) {
    if (band == kBand0To8kHz) {
      pIVar1 = std::
               unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>::
               operator->(&this->data_);
      pCVar2 = IFChannelBuffer::ibuf(pIVar1);
      local_30 = (AudioBuffer *)ChannelBuffer<short>::channels(pCVar2);
    }
    else {
      local_30 = (AudioBuffer *)0x0;
    }
    this_local = local_30;
  }
  else {
    pIVar1 = std::unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
             ::operator->(&this->split_data_);
    pCVar2 = IFChannelBuffer::ibuf(pIVar1);
    this_local = (AudioBuffer *)ChannelBuffer<short>::channels(pCVar2,(ulong)band);
  }
  return (int16_t **)this_local;
}

Assistant:

int16_t* const* AudioBuffer::split_channels(Band band) {
  mixed_low_pass_valid_ = false;
  if (split_data_.get()) {
    return split_data_->ibuf()->channels(band);
  } else {
    return band == kBand0To8kHz ? data_->ibuf()->channels() : nullptr;
  }
}